

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<std::complex<double>_> __thiscall
qclab::dense::operator-
          (dense *this,SquareMatrix<std::complex<double>_> *lhs,
          SquareMatrix<std::complex<double>_> *rhs)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  complex<double> *pcVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  data_type extraout_RDX;
  long lVar9;
  long lVar10;
  long lVar11;
  SquareMatrix<std::complex<double>_> SVar12;
  
  lVar7 = rhs->size_;
  if (lVar7 == lhs->size_) {
    if (0 < lVar7) {
      lVar8 = 0;
      lVar9 = 0;
      do {
        if (0 < lVar7) {
          lVar10 = 0;
          lVar11 = 0;
          do {
            pcVar4 = (lhs->data_)._M_t.
                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                     .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
            pdVar1 = (double *)
                     (((rhs->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value
                     + lVar10 + rhs->size_ * lVar8);
            dVar5 = pdVar1[1];
            pdVar2 = (double *)(pcVar4->_M_value + lVar10 + lVar7 * lVar8);
            dVar6 = pdVar2[1];
            pdVar3 = (double *)(pcVar4->_M_value + lVar10 + lVar7 * lVar8);
            *pdVar3 = *pdVar2 - *pdVar1;
            pdVar3[1] = dVar6 - dVar5;
            lVar11 = lVar11 + 1;
            lVar7 = lhs->size_;
            lVar10 = lVar10 + 0x10;
          } while (lVar11 < lVar7);
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar9 < lVar7);
    }
    SquareMatrix<std::complex<double>_>::SquareMatrix
              ((SquareMatrix<std::complex<double>_> *)this,lhs);
    SVar12.data_._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
         extraout_RDX._M_t.
         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
         _M_t.
         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
    SVar12.size_ = (size_type_conflict)this;
    return SVar12;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0xa4,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<double>>::operator-=(const SquareMatrix<T> &) [T = std::complex<double>]"
               );
}

Assistant:

inline int64_t size() const { return size_ ; }